

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTables::visit(SemanticTables *this,FunctionListNode *functionListNode)

{
  FunctionListNode *pFVar1;
  FunctionNode *pFVar2;
  
  pFVar1 = functionListNode->next;
  if (pFVar1 != (FunctionListNode *)0x0) {
    (*(pFVar1->super_ASTNode)._vptr_ASTNode[3])(pFVar1,this);
  }
  pFVar2 = functionListNode->function;
  if (pFVar2 != (FunctionNode *)0x0) {
    (*(pFVar2->super_ASTNode)._vptr_ASTNode[3])(pFVar2,this);
    return;
  }
  return;
}

Assistant:

void SemanticTables::visit(FunctionListNode *functionListNode) {
    if (functionListNode->getNext()) {
        functionListNode->getNext()->accept(this);
    }
    if (functionListNode->getFunction()) {
        functionListNode->getFunction()->accept(this);
    }
}